

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodedstream.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte bVar1;
  MemoryStream *pMVar2;
  byte *pbVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  char *pcVar12;
  SizeType SVar13;
  int iVar14;
  char *pcVar15;
  ulong uVar16;
  ulong i;
  bool bVar17;
  int iVar18;
  int iVar19;
  uint i_00;
  double d;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dStack_68;
  NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
  NStack_50;
  GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *pGStack_48;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGStack_40;
  ulong uStack_38;
  
  pbVar11 = (byte *)is->is_->src_;
  if (pbVar11 != (byte *)is->is_->end_) {
    bVar1 = *pbVar11;
    uStack_38 = (ulong)bVar1;
    if (bVar1 == 0x22) {
      ParseString<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler,false);
      return;
    }
    if (bVar1 == 0x5b) {
      pMVar2 = is->is_;
      pcVar12 = pMVar2->src_;
      if ((pcVar12 == pMVar2->end_) || (*pcVar12 != '[')) {
        __assert_fail("is.Peek() == \'[\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x329,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pMVar2->src_ = pcVar12 + 1;
      bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::StartArray(handler);
      if (bVar6) {
        SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                  (is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        bVar6 = Consume<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                          (is,']');
        if (bVar6) {
          bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::EndArray(handler,0);
          if (bVar6) {
            return;
          }
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                          ,0x334,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
        }
        else {
          SVar13 = 1;
          while( true ) {
            ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                      (is);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            bVar6 = Consume<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                              (is,',');
            if (!bVar6) break;
            SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                      (is);
            SVar13 = SVar13 + 1;
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
          }
          bVar6 = Consume<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                            (is,']');
          if (!bVar6) {
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                            ,0x34a,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            lVar9 = (long)is->is_->src_ - (long)is->is_->begin_;
            *(undefined4 *)(this + 0x30) = 7;
            goto LAB_0016619f;
          }
          bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::EndArray(handler,SVar13);
          if (bVar6) {
            return;
          }
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                          ,0x346,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
        }
      }
      else if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x32d,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      lVar9 = (long)is->is_->src_ - (long)is->is_->begin_;
      *(undefined4 *)(this + 0x30) = 0x10;
LAB_0016619f:
      *(long *)(this + 0x38) = lVar9;
      return;
    }
    if (bVar1 == 0x66) {
      pMVar2 = is->is_;
      pcVar12 = pMVar2->src_;
      if ((pcVar12 == pMVar2->end_) || (*pcVar12 != 'f')) {
        __assert_fail("is.Peek() == \'f\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x373,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pMVar2->src_ = pcVar12 + 1;
      bVar6 = Consume<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                        (is,'a');
      if ((((bVar6) &&
           (bVar6 = Consume<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                              (is,'l'), bVar6)) &&
          (bVar6 = Consume<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                             (is,'s'), bVar6)) &&
         (bVar6 = Consume<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                            (is,'e'), bVar6)) {
        bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Bool(handler,false);
        if (bVar6) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                        ,0x378,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        lVar9 = (long)is->is_->src_ - (long)is->is_->begin_;
        *(undefined4 *)(this + 0x30) = 0x10;
      }
      else {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                        ,0x37b,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        lVar9 = (long)is->is_->src_ - (long)is->is_->begin_;
        *(undefined4 *)(this + 0x30) = 3;
      }
      *(long *)(this + 0x38) = lVar9;
      return;
    }
    if (bVar1 == 0x7b) {
      pMVar2 = is->is_;
      pcVar12 = pMVar2->src_;
      if ((pcVar12 == pMVar2->end_) || (*pcVar12 != '{')) {
        pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)0x165fe6;
        __assert_fail("is.Peek() == \'{\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x2e5,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pMVar2->src_ = pcVar12 + 1;
      pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    *)0x165e07;
      bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::StartObject(handler);
      if (bVar6) {
        pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)0x165e17;
        SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                  (is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)0x165e2c;
        bVar6 = Consume<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                          (is,'}');
        if (!bVar6) {
          SVar13 = 1;
          do {
            pMVar2 = is->is_;
            pcVar12 = pMVar2->src_;
            if ((pcVar12 == pMVar2->end_) || (*pcVar12 != '\"')) {
              if (*(int *)(this + 0x30) != 0) {
                pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                              *)0x16601e;
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                              ,0x2f6,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              lVar9 = (long)pcVar12 - (long)pMVar2->begin_;
              *(undefined4 *)(this + 0x30) = 4;
              goto LAB_00165f88;
            }
            pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)0x165ea0;
            ParseString<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler,true);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)0x165eb2;
            SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                      (is);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)0x165ec7;
            bVar6 = Consume<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                              (is,':');
            if (!bVar6) {
              if (*(int *)(this + 0x30) != 0) {
                pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                              *)0x16603d;
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                              ,0x2ff,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              lVar9 = (long)is->is_->src_ - (long)is->is_->begin_;
              *(undefined4 *)(this + 0x30) = 5;
              goto LAB_00165f88;
            }
            pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)0x165ed7;
            SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                      (is);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)0x165eef;
            ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)0x165f01;
            SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                      (is);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pMVar2 = is->is_;
            pcVar12 = pMVar2->src_;
            if (pcVar12 == pMVar2->end_) {
LAB_00165f7d:
              lVar9 = (long)pcVar12 - (long)pMVar2->begin_;
              *(undefined4 *)(this + 0x30) = 6;
              goto LAB_00165f88;
            }
            if (*pcVar12 != ',') {
              if (*pcVar12 != '}') goto LAB_00165f7d;
              pMVar2->src_ = pcVar12 + 1;
              pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                            *)0x165f50;
              bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      ::EndObject(handler,SVar13);
              if (bVar6) {
                return;
              }
              if (*(int *)(this + 0x30) != 0) {
                pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                              *)0x165f7d;
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                              ,0x315,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              goto LAB_00165fec;
            }
            pMVar2->src_ = pcVar12 + 1;
            pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)0x165f2d;
            SkipWhitespace<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                      (is);
            SVar13 = SVar13 + 1;
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
          } while( true );
        }
        pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)0x165e3a;
        bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndObject(handler,0);
        if (bVar6) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *)0x165e6b;
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                        ,0x2f0,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
      else if (*(int *)(this + 0x30) != 0) {
        pGStack_40 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)
                     ParseArray<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
        ;
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x2e9,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
LAB_00165fec:
      lVar9 = (long)is->is_->src_ - (long)is->is_->begin_;
      *(undefined4 *)(this + 0x30) = 0x10;
LAB_00165f88:
      *(long *)(this + 0x38) = lVar9;
      return;
    }
    if (bVar1 == 0x74) {
      pMVar2 = is->is_;
      pcVar12 = pMVar2->src_;
      if ((pcVar12 == pMVar2->end_) || (*pcVar12 != 't')) {
        __assert_fail("is.Peek() == \'t\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x366,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pMVar2->src_ = pcVar12 + 1;
      bVar6 = Consume<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                        (is,'r');
      if (((bVar6) &&
          (bVar6 = Consume<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                             (is,'u'), bVar6)) &&
         (bVar6 = Consume<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                            (is,'e'), bVar6)) {
        bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Bool(handler,true);
        if (bVar6) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                        ,0x36b,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        lVar9 = (long)is->is_->src_ - (long)is->is_->begin_;
        *(undefined4 *)(this + 0x30) = 0x10;
      }
      else {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                        ,0x36e,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        lVar9 = (long)is->is_->src_ - (long)is->is_->begin_;
        *(undefined4 *)(this + 0x30) = 3;
      }
      *(long *)(this + 0x38) = lVar9;
      return;
    }
    if (bVar1 == 0x6e) {
      ParseNull<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler);
      return;
    }
  }
  uStack_38 = (long)is->is_->src_ - (long)is->is_->begin_;
  NStack_50.is = is;
  pGStack_48 = this;
  bVar6 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,false,false>>
                    (&NStack_50,'-');
  pMVar2 = (NStack_50.is)->is_;
  pbVar11 = (byte *)pMVar2->src_;
  pbVar3 = (byte *)pMVar2->end_;
  if (pbVar11 == pbVar3) {
LAB_00166897:
    if (*(int *)(pGStack_48 + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                    ,0x602,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    uStack_38 = (long)pbVar11 - (long)pMVar2->begin_;
    *(undefined4 *)(pGStack_48 + 0x30) = 3;
    goto LAB_00166805;
  }
  pGStack_40 = handler;
  if (*pbVar11 == 0x30) {
    pMVar2->src_ = (Ch *)(pbVar11 + 1);
    dStack_68 = 0.0;
    bVar8 = false;
    i = 0;
    iVar19 = 0;
    bVar17 = false;
    bVar5 = false;
    i_00 = 0;
  }
  else {
    if (8 < (byte)(*pbVar11 - 0x31)) goto LAB_00166897;
    pbVar10 = pbVar11 + 1;
    pMVar2->src_ = (Ch *)pbVar10;
    i_00 = (int)(char)*pbVar11 - 0x30;
    iVar18 = (int)pbVar3 - (int)pbVar10;
    iVar14 = 0;
    if (bVar6) {
LAB_001662ad:
      iVar19 = iVar18;
      if ((pbVar10 == pbVar3) || (iVar19 = iVar14, 9 < (byte)(*pbVar10 - 0x30))) goto LAB_001663f4;
      if (i_00 < 0xccccccc) {
LAB_001662d0:
        pMVar2->src_ = (Ch *)(pbVar10 + 1);
        i_00 = (i_00 * 10 + (int)(char)*pbVar10) - 0x30;
        iVar14 = iVar14 + 1;
        pbVar10 = pbVar10 + 1;
        goto LAB_001662ad;
      }
      if (i_00 != 0xccccccc) goto LAB_0016634d;
      if (*pbVar10 != 0x39) goto LAB_001662d0;
      i_00 = 0xccccccc;
LAB_0016634d:
      uVar16 = (ulong)i_00;
      iVar18 = ((int)pbVar3 + iVar14) - (int)pbVar10;
      if (bVar6) {
        while ((i = uVar16, iVar19 = iVar18, pbVar10 != pbVar3 &&
               (iVar19 = iVar14, (byte)(*pbVar10 - 0x30) < 10))) {
          if ((0xccccccccccccccb < uVar16) &&
             ((uVar16 != 0xccccccccccccccc || (i = 0xccccccccccccccc, *pbVar10 == 0x39))))
          goto LAB_00166465;
          pMVar2->src_ = (Ch *)(pbVar10 + 1);
          uVar16 = (ulong)((int)(char)*pbVar10 - 0x30) + uVar16 * 10;
          iVar14 = iVar14 + 1;
          pbVar10 = pbVar10 + 1;
        }
      }
      else {
        while ((i = uVar16, iVar19 = iVar18, pbVar10 != pbVar3 &&
               (iVar19 = iVar14, (byte)(*pbVar10 - 0x30) < 10))) {
          if ((0x1999999999999998 < uVar16) &&
             ((uVar16 != 0x1999999999999999 || (i = 0x1999999999999999, 0x35 < *pbVar10))))
          goto LAB_00166465;
          pMVar2->src_ = (Ch *)(pbVar10 + 1);
          uVar16 = (ulong)((int)(char)*pbVar10 - 0x30) + uVar16 * 10;
          iVar14 = iVar14 + 1;
          pbVar10 = pbVar10 + 1;
        }
      }
      dStack_68 = 0.0;
      bVar8 = false;
      bVar5 = true;
      bVar17 = false;
    }
    else {
      while ((iVar19 = iVar18, pbVar10 != pbVar3 && (iVar19 = iVar14, (byte)(*pbVar10 - 0x30) < 10))
            ) {
        if (0x19999998 < i_00) {
          if (i_00 != 0x19999999) goto LAB_0016634d;
          if (0x35 < *pbVar10) {
            i_00 = 0x19999999;
            goto LAB_0016634d;
          }
        }
        pMVar2->src_ = (Ch *)(pbVar10 + 1);
        i_00 = (i_00 * 10 + (int)(char)*pbVar10) - 0x30;
        iVar14 = iVar14 + 1;
        pbVar10 = pbVar10 + 1;
      }
LAB_001663f4:
      dStack_68 = 0.0;
      bVar8 = false;
      i = 0;
      bVar17 = false;
      bVar5 = false;
    }
  }
  goto LAB_00166509;
LAB_00166465:
  auVar20._8_4_ = (int)(i >> 0x20);
  auVar20._0_8_ = i;
  auVar20._12_4_ = 0x45300000;
  dStack_68 = (auVar20._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  while ((pbVar10 != pbVar3 && ((byte)(*pbVar10 - 0x30) < 10))) {
    pMVar2->src_ = (Ch *)(pbVar10 + 1);
    dStack_68 = dStack_68 * 10.0 + (double)((char)*pbVar10 + -0x30);
    pbVar10 = pbVar10 + 1;
  }
  bVar8 = true;
  bVar17 = true;
  bVar5 = true;
LAB_00166509:
  bVar7 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,false,false>>
                    (&NStack_50,'.');
  iVar14 = 0;
  if (bVar7) {
    pMVar2 = (NStack_50.is)->is_;
    pbVar11 = (byte *)pMVar2->src_;
    pbVar3 = (byte *)pMVar2->end_;
    if ((pbVar11 == pbVar3) || ((byte)(*pbVar11 - 0x3a) < 0xf6)) {
      if (*(int *)(pGStack_48 + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x62d,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      uStack_38 = (long)pbVar11 - (long)pMVar2->begin_;
      *(undefined4 *)(pGStack_48 + 0x30) = 0xe;
      goto LAB_00166805;
    }
    iVar14 = 0;
    if (!bVar8) {
      if (!bVar5) {
        i = (ulong)i_00;
      }
      iVar18 = 0;
      pbVar10 = pbVar11;
      while ((((iVar14 = (int)pbVar11 - (int)pbVar3, pbVar10 != pbVar3 &&
               (iVar14 = iVar18, '/' < (char)*pbVar10)) && (*pbVar10 < 0x3a)) && (i >> 0x35 == 0)))
      {
        pMVar2->src_ = (Ch *)(pbVar10 + 1);
        iVar18 = iVar18 + -1;
        i = (ulong)((int)(char)*pbVar10 - 0x30) + i * 10;
        iVar19 = iVar19 + (uint)(i != 0);
        pbVar10 = pbVar10 + 1;
      }
      auVar21._8_4_ = (int)(i >> 0x20);
      auVar21._0_8_ = i;
      auVar21._12_4_ = 0x45300000;
      dStack_68 = (auVar21._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
      bVar17 = true;
      pbVar11 = pbVar10;
    }
    while ((pbVar10 = pbVar11, pbVar10 != pbVar3 && ((byte)(*pbVar10 - 0x30) < 10))) {
      pbVar11 = pbVar10 + 1;
      pMVar2->src_ = (Ch *)pbVar11;
      if (iVar19 < 0x11) {
        dStack_68 = dStack_68 * 10.0 + (double)((char)*pbVar10 + -0x30);
        iVar14 = iVar14 + -1;
        if (0.0 < dStack_68) {
          iVar19 = iVar19 + 1;
        }
      }
    }
  }
  bVar8 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,false,false>>
                    (&NStack_50,'e');
  if (bVar8) {
LAB_00166660:
    uVar16 = (ulong)i_00;
    if (bVar5) {
      uVar16 = i;
    }
    if (!bVar17) {
      auVar22._8_4_ = (int)(uVar16 >> 0x20);
      auVar22._0_8_ = uVar16;
      auVar22._12_4_ = 0x45300000;
      dStack_68 = (auVar22._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0);
      bVar17 = true;
    }
    bVar8 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,false,false>>
                      (&NStack_50,'+');
    if (bVar8) {
      bVar8 = false;
    }
    else {
      bVar8 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,false,false>>
                        (&NStack_50,'-');
    }
    pMVar2 = (NStack_50.is)->is_;
    pcVar12 = pMVar2->src_;
    pcVar4 = pMVar2->end_;
    if ((pcVar12 == pcVar4) || (9 < (byte)(*pcVar12 - 0x30U))) {
      if (*(int *)(pGStack_48 + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x682,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      uStack_38 = (long)pcVar12 - (long)pMVar2->begin_;
      *(undefined4 *)(pGStack_48 + 0x30) = 0xf;
      goto LAB_00166805;
    }
    pcVar15 = pcVar12 + 1;
    pMVar2->src_ = pcVar15;
    iVar18 = *pcVar12 + -0x30;
    if (bVar8 == false) {
      do {
        if ((pcVar15 == pcVar4) || (9 < (byte)(*pcVar15 - 0x30U))) goto LAB_001667c0;
        pMVar2->src_ = pcVar15 + 1;
        iVar18 = (int)*pcVar15 + iVar18 * 10 + -0x30;
        pcVar15 = pcVar15 + 1;
      } while (iVar18 <= 0x134 - iVar14);
      if (*(int *)(pGStack_48 + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x67d,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(pGStack_48 + 0x30) = 0xd;
      goto LAB_00166805;
    }
    if (0 < iVar14) {
      __assert_fail("expFrac <= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                    ,0x66d,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    while ((pcVar15 != pcVar4 && ((byte)(*pcVar15 - 0x30U) < 10))) {
      pcVar12 = pcVar15 + 1;
      pMVar2->src_ = pcVar12;
      iVar18 = iVar18 * 10 + (int)*pcVar15 + -0x30;
      pcVar15 = pcVar12;
      if ((iVar14 + 0x7ffffff7) / 10 < iVar18) {
        while ((pcVar15 = pcVar12, pcVar12 != pcVar4 && ((byte)(*pcVar12 - 0x30U) < 10))) {
          pcVar12 = pcVar12 + 1;
          pMVar2->src_ = pcVar12;
        }
      }
    }
LAB_001667c0:
    iVar19 = -iVar18;
    if (bVar8 == false) {
      iVar19 = iVar18;
    }
  }
  else {
    bVar8 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,false,false>>
                      (&NStack_50,'E');
    iVar19 = 0;
    if (bVar8) goto LAB_00166660;
  }
  if (bVar17) {
    d = internal::StrtodNormalPrecision(dStack_68,iVar19 + iVar14);
    if (1.79769313486232e+308 < d) {
      if (*(int *)(pGStack_48 + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x6b1,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(pGStack_48 + 0x30) = 0xd;
      goto LAB_00166805;
    }
    if (bVar6) {
      d = -d;
    }
    bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Double(pGStack_40,d);
  }
  else if (bVar5) {
    if (bVar6) {
      bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int64(pGStack_40,-i);
    }
    else {
      bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint64(pGStack_40,i);
    }
  }
  else if (bVar6) {
    bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Int(pGStack_40,-i_00);
  }
  else {
    bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Uint(pGStack_40,i_00);
  }
  if (bVar6 != false) {
    return;
  }
  if (*(int *)(pGStack_48 + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                  ,0x6c9,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  *(undefined4 *)(pGStack_48 + 0x30) = 0x10;
LAB_00166805:
  *(ulong *)(pGStack_48 + 0x38) = uStack_38;
  return;
}

Assistant:

Ch Peek() const { return is_.Peek(); }